

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_value_t.c
# Opt level: O0

void test_complex_map_c_result(int status,MMDB_entry_data_s entry_data,char *function)

{
  char *function_local;
  int status_local;
  
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_t.c"
                ,0xda,status,"==",0,
                "status for %s() is MMDB_SUCCESS - map1{map2}{array}[0]{map3}{c}",function,0);
  ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_t.c"
            ,0xdb,entry_data.has_data & 1,"found a value for map1{map2}{array}[0]{map3}{c}",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_t.c"
                ,0xdf,entry_data.type,"==",6,
                "returned entry type is uint32 - map1{map2}{array}[0]{map3}{c}",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_t.c"
                ,0xe3,entry_data.field_1.int32,"==",3,
                "entry value is 3 - map1{map2}{array}[0]{map3}{c}",0);
  return;
}

Assistant:

void test_complex_map_c_result(int status,
                               MMDB_entry_data_s entry_data,
                               char *function) {
    cmp_ok(status,
           "==",
           MMDB_SUCCESS,
           "status for %s() is MMDB_SUCCESS - map1{map2}{array}[0]{map3}{c}",
           function);
    ok(entry_data.has_data, "found a value for map1{map2}{array}[0]{map3}{c}");
    cmp_ok(entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "returned entry type is uint32 - map1{map2}{array}[0]{map3}{c}");
    cmp_ok(entry_data.uint32,
           "==",
           3,
           "entry value is 3 - map1{map2}{array}[0]{map3}{c}");
}